

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::makeMask(Image *this)

{
  uint8 *puVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  byte bVar8;
  byte *pbVar9;
  
  iVar5 = this->depth;
  switch(iVar5 << 0x1e | iVar5 - 4U >> 2) {
  case 0:
  case 1:
    if (iVar5 != 0x1f) {
      uVar2 = 1 << ((byte)iVar5 & 0x1f);
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 2) {
        uVar3 = 1;
      }
      uVar6 = 0;
      do {
        puVar1 = this->palette;
        bVar8 = puVar1[uVar6 * 4];
        if (puVar1[uVar6 * 4] < puVar1[uVar6 * 4 + 1]) {
          bVar8 = puVar1[uVar6 * 4 + 1];
        }
        if (bVar8 < puVar1[uVar6 * 4 + 2]) {
          bVar8 = puVar1[uVar6 * 4 + 2];
        }
        puVar1[uVar6 * 4 + 3] = bVar8;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    break;
  case 3:
  case 5:
    convertTo32(this);
  case 7:
    if (0 < this->height) {
      pbVar4 = this->pixels;
      iVar5 = 0;
      do {
        if (0 < this->width) {
          iVar7 = 0;
          pbVar9 = pbVar4;
          do {
            bVar8 = *pbVar9;
            if (*pbVar9 < pbVar9[1]) {
              bVar8 = pbVar9[1];
            }
            if (bVar8 < pbVar9[2]) {
              bVar8 = pbVar9[2];
            }
            pbVar9[3] = bVar8;
            pbVar9 = pbVar9 + this->bpp;
            iVar7 = iVar7 + 1;
          } while (iVar7 < this->width);
        }
        pbVar4 = pbVar4 + this->stride;
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->height);
    }
  }
  return;
}

Assistant:

void
Image::makeMask(void)
{
	int32 maxcol;
	switch(this->depth){
	case 4:
	case 8: {
		assert(this->palette);
		int32 pallen = 1 << this->depth;
		for(int32 i = 0; i < pallen; i++){
			maxcol = this->palette[i*4+0];
			if(this->palette[i*4+1] > maxcol) maxcol = this->palette[i*4+1];
			if(this->palette[i*4+2] > maxcol) maxcol = this->palette[i*4+2];
			this->palette[i*4+3] = maxcol;
		}
		break;
	}

	case 16:
	case 24:
		this->convertTo32();
		// fallthrough

	case 32: {
		assert(this->pixels);
		uint8 *line = this->pixels;
		uint8 *p;
		for(int32 y = 0; y < this->height; y++){
			p = line;
			for(int32 x = 0; x < this->width; x++){
				maxcol = p[0];
				if(p[1] > maxcol) maxcol = p[1];
				if(p[2] > maxcol) maxcol = p[2];
				p[3] = maxcol;
				p += this->bpp;
			}
			line += this->stride;
		}
		break;
	}
	}
}